

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerCPP::emit_function_prototype
          (CompilerCPP *this,SPIRFunction *func,Bitset *param_2)

{
  Parameter *pPVar1;
  bool bVar2;
  uint32_t uVar3;
  Parameter *pPVar4;
  SPIRVariable *pSVar5;
  SPIRVariable *var;
  Parameter *local_b8;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  string local_78 [48];
  SPIRType *local_48;
  SPIRType *type;
  string decl;
  Bitset *param_2_local;
  SPIRFunction *func_local;
  CompilerCPP *this_local;
  
  bVar2 = TypedID<(spirv_cross::Types)0>::operator!=
                    (&(func->super_IVariant).self,
                     &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (bVar2) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_CompilerGLSL).local_variable_names,
              &(this->super_CompilerGLSL).resource_names);
  ::std::__cxx11::string::string((string *)&type);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).field_0xc);
  local_48 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  ::std::__cxx11::string::operator+=((string *)&type,"inline ");
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_78,this,local_48,0);
  ::std::__cxx11::string::operator+=((string *)&type,local_78);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::operator+=((string *)&type," ");
  bVar2 = TypedID<(spirv_cross::Types)0>::operator==
                    (&(func->super_IVariant).self,
                     &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  if (bVar2) {
    ::std::__cxx11::string::operator+=((string *)&type,"main");
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&__range1,this,(ulong)uVar3,1);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)&__range1);
    ::std::__cxx11::string::~string((string *)&__range1);
  }
  ::std::__cxx11::string::operator+=((string *)&type,"(");
  __begin1 = (Parameter *)&func->arguments;
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                  ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  for (; __end1 != arg; __end1 = __end1 + 1) {
    local_b8 = __end1;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar3);
    argument_decl_abi_cxx11_((CompilerCPP *)&var,(Parameter *)this);
    ::std::__cxx11::string::operator+=((string *)&type,(string *)&var);
    ::std::__cxx11::string::~string((string *)&var);
    pPVar1 = local_b8;
    pPVar4 = VectorView<spirv_cross::SPIRFunction::Parameter>::back
                       (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
    if (pPVar1 != pPVar4) {
      ::std::__cxx11::string::operator+=((string *)&type,", ");
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_b8->id);
    pSVar5 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar3);
    if (pSVar5 != (SPIRVariable *)0x0) {
      pSVar5->parameter = local_b8;
    }
  }
  ::std::__cxx11::string::operator+=((string *)&type,")");
  CompilerGLSL::statement<std::__cxx11::string&>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
  ::std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void CompilerCPP::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	auto &type = get<SPIRType>(func.return_type);
	decl += "inline ";
	decl += type_to_glsl(type);
	decl += " ";

	if (func.self == ir.default_entry_point)
	{
		decl += "main";
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	for (auto &arg : func.arguments)
	{
		add_local_variable_name(arg.id);

		decl += argument_decl(arg);
		if (&arg != &func.arguments.back())
			decl += ", ";

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += ")";
	statement(decl);
}